

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::HistogramBinBindFunction<duckdb::HistogramExact>
          (duckdb *this,ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  pointer puVar1;
  pointer pEVar2;
  ParameterNotResolvedException *this_00;
  reference this_01;
  pointer this_02;
  AggregateFunction AStack_158;
  
  this_02 = (arguments->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (arguments->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (this_02 == puVar1) {
      this_01 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::get<true>(arguments,0);
      pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_01);
      GetHistogramBinFunction<duckdb::HistogramExact>(&AStack_158,(LogicalType *)(pEVar2 + 0x38));
      AggregateFunction::operator=(function,&AStack_158);
      AggregateFunction::~AggregateFunction(&AStack_158);
      *(undefined8 *)this = 0;
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
    }
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_02);
    this_02 = this_02 + 1;
  } while (pEVar2[0x38] != (Expression)0x2);
  this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
  duckdb::ParameterNotResolvedException::ParameterNotResolvedException(this_00);
  __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FunctionData> HistogramBinBindFunction(ClientContext &context, AggregateFunction &function,
                                                  vector<unique_ptr<Expression>> &arguments) {
	for (auto &arg : arguments) {
		if (arg->return_type.id() == LogicalTypeId::UNKNOWN) {
			throw ParameterNotResolvedException();
		}
	}

	function = GetHistogramBinFunction<HIST>(arguments[0]->return_type);
	return nullptr;
}